

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_visuals.cxx
# Opt level: O0

void __thiscall
level_tools::calculate_subdivisions
          (level_tools *this,size_t *vb_size,size_t *ib_size,uint32_t ogf_idx)

{
  xr_ogf *this_00;
  bool bVar1;
  uint uVar2;
  uint32_t eshader_idx;
  int iVar3;
  const_reference ppxVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  reference puVar6;
  undefined4 extraout_var;
  size_t sVar7;
  undefined4 extraout_var_00;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  const_iterator end;
  const_iterator it;
  xr_ogf *ogf;
  uint32_t ogf_idx_local;
  size_t *ib_size_local;
  size_t *vb_size_local;
  level_tools *this_local;
  
  ppxVar4 = std::vector<xray_re::xr_ogf_*,_std::allocator<xray_re::xr_ogf_*>_>::at
                      (this->m_subdivisions,(ulong)ogf_idx);
  this_00 = *ppxVar4;
  uVar2 = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x16])();
  if ((uVar2 & 1) == 0) {
    eshader_idx = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory
                    [0x1e])();
    bVar1 = is_compiled_wallmark(this,eshader_idx);
    if (!bVar1) {
      iVar3 = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x1f])
                        ();
      sVar7 = xray_re::xr_flexbuf::size((xr_flexbuf *)CONCAT44(extraout_var,iVar3));
      *vb_size = sVar7 + *vb_size;
      iVar3 = (*(this_00->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x20])
                        ();
      sVar7 = xray_re::xr_flexbuf::size((xr_flexbuf *)CONCAT44(extraout_var_00,iVar3));
      *ib_size = sVar7 + *ib_size;
    }
  }
  else {
    pvVar5 = xray_re::xr_ogf::children_l(this_00);
    end = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(pvVar5);
    pvVar5 = xray_re::xr_ogf::children_l(this_00);
    local_40._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=(&end,&local_40), bVar1) {
      puVar6 = __gnu_cxx::
               __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&end);
      calculate_subdivisions(this,vb_size,ib_size,*puVar6);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::operator++(&end);
    }
  }
  return;
}

Assistant:

void level_tools::calculate_subdivisions(size_t& vb_size, size_t& ib_size, uint32_t ogf_idx) const
{
	const xr_ogf* ogf = m_subdivisions->at(ogf_idx);
	if (ogf->hierarchical()) {
		for (std::vector<uint32_t>::const_iterator it = ogf->children_l().begin(),
				end = ogf->children_l().end(); it != end; ++it) {
			calculate_subdivisions(vb_size, ib_size, *it);
		}
	} else if (is_compiled_wallmark(ogf->shader_l())) {
		// FIXME: this might be useful to restore wallmarks
		// even if there is no redundant level.wallmarks
	} else {
		vb_size += ogf->vb().size();
		ib_size += ogf->ib().size();
	}
}